

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog.cpp
# Opt level: O0

void __thiscall Dialog::Dialog(Dialog *this)

{
  Dialog *this_local;
  
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque(&this->pages);
  std::
  multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap(&this->links);
  return;
}

Assistant:

Dialog::Dialog()
{

}